

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_atan2>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  __m512 *pafVar1;
  void *pvVar2;
  void *pvVar3;
  __m512 y;
  __m512 x;
  uint uVar4;
  ulong extraout_RAX;
  ulong uVar6;
  long lVar7;
  float *pfVar8;
  __m512 *__return_storage_ptr__;
  long lVar9;
  long lVar10;
  int iVar11;
  float *pfVar12;
  float *y_00;
  long lVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar17 [56];
  undefined1 auVar16 [64];
  __m128 afVar18;
  binary_op_atan2 op;
  __m256 _p1;
  __m256 _p;
  undefined4 in_stack_ffffffffffffff00;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  void *pvVar23;
  void *pvVar24;
  __m512 *pafVar25;
  undefined8 in_stack_ffffffffffffff60;
  ulong in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70 [16];
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  ulong uVar5;
  
  uVar4 = a->h * a->w * a->d * a->elempack;
  uVar5 = (ulong)uVar4;
  uVar6 = 0;
  uVar19 = (ulong)(uint)a->c;
  if (a->c < 1) {
    uVar19 = uVar6;
  }
  for (; uVar6 != uVar19; uVar6 = uVar6 + 1) {
    pafVar1 = (__m512 *)a->data;
    pvVar2 = b->data;
    pvVar3 = c->data;
    lVar7 = c->elemsize * c->cstep * uVar6;
    lVar10 = b->elemsize * b->cstep * uVar6;
    lVar9 = a->elemsize * a->cstep * uVar6;
    lVar13 = 0;
    __return_storage_ptr__ = pafVar1;
    lVar20 = lVar7;
    lVar21 = lVar10;
    lVar22 = lVar9;
    pvVar23 = pvVar3;
    pvVar24 = pvVar2;
    pafVar25 = pafVar1;
    for (iVar11 = 0; iVar11 + 0xf < (int)uVar4; iVar11 = iVar11 + 0x10) {
      auVar16 = *(undefined1 (*) [64])((long)*pafVar1 + lVar13 + lVar9);
      y[1] = (float)uVar4;
      y[0] = (float)in_stack_ffffffffffffff00;
      y._8_8_ = b;
      y._16_8_ = a;
      y._24_8_ = c;
      y[8] = (float)(int)uVar19;
      y[9] = (float)(int)(uVar19 >> 0x20);
      y[10] = (float)(int)lVar20;
      y[0xb] = (float)(int)((ulong)lVar20 >> 0x20);
      y[0xc] = (float)(int)lVar21;
      y[0xd] = (float)(int)((ulong)lVar21 >> 0x20);
      y[0xe] = (float)(int)lVar22;
      y[0xf] = (float)(int)((ulong)lVar22 >> 0x20);
      x._8_8_ = pvVar24;
      x._0_8_ = pvVar23;
      x._16_8_ = pafVar25;
      x[6] = (float)(int)uVar6;
      x[7] = (float)(int)(uVar6 >> 0x20);
      x[8] = (float)in_stack_ffffffffffffff60;
      x[9] = SUB84(in_stack_ffffffffffffff60,4);
      x[10] = (float)(int)in_stack_ffffffffffffff68;
      x[0xb] = (float)(int)(in_stack_ffffffffffffff68 >> 0x20);
      x[0xc] = (float)in_stack_ffffffffffffff70._0_4_;
      x[0xd] = (float)in_stack_ffffffffffffff70._4_4_;
      x[0xe] = (float)in_stack_ffffffffffffff70._8_4_;
      x[0xf] = (float)in_stack_ffffffffffffff70._12_4_;
      atan2512_ps(__return_storage_ptr__,y,x);
      *(undefined1 (*) [64])((long)pvVar3 + lVar13 + lVar7) = auVar16;
      lVar13 = lVar13 + 0x40;
    }
    for (; iVar11 + 7 < (int)uVar4; iVar11 = iVar11 + 8) {
      pfVar8 = (float *)((long)*pafVar1 + lVar13 + lVar9);
      local_80 = *(float (*) [2])pfVar8;
      afStack_78 = *(float (*) [2])(pfVar8 + 2);
      afStack_70 = *(float (*) [2])(pfVar8 + 4);
      afStack_68._0_8_ = *(undefined8 *)(pfVar8 + 6);
      auVar15 = *(undefined1 (*) [32])((long)pvVar2 + lVar13 + lVar10);
      in_stack_ffffffffffffff60 = auVar15._0_8_;
      in_stack_ffffffffffffff68 = auVar15._8_8_;
      in_stack_ffffffffffffff70 = auVar15._16_16_;
      BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                ((binary_op_atan2 *)&stack0xffffffffffffff03,(__m256 *)local_80,
                 (__m256 *)&stack0xffffffffffffff60);
      *(undefined1 (*) [32])((long)pvVar3 + lVar13 + lVar7) = auVar15;
      lVar13 = lVar13 + 0x20;
    }
    for (; uVar5 = (ulong)(iVar11 + 3U), (int)(iVar11 + 3U) < (int)uVar4; iVar11 = iVar11 + 4) {
      pfVar8 = (float *)((long)*pafVar1 + lVar13 + lVar9);
      local_80 = *(float (*) [2])pfVar8;
      afStack_78 = *(float (*) [2])(pfVar8 + 2);
      pfVar8 = (float *)((long)pvVar2 + lVar13 + lVar10);
      in_stack_ffffffffffffff60 = *(undefined8 *)pfVar8;
      in_stack_ffffffffffffff68 = *(ulong *)(pfVar8 + 2);
      auVar17 = ZEXT856(in_stack_ffffffffffffff68);
      afVar18 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                          ((binary_op_atan2 *)&stack0xffffffffffffff03,(__m128 *)local_80,
                           (__m128 *)&stack0xffffffffffffff60);
      auVar16._0_8_ = afVar18._0_8_;
      auVar16._8_56_ = auVar17;
      *(undefined1 (*) [16])((long)pvVar3 + lVar13 + lVar7) = auVar16._0_16_;
      lVar13 = lVar13 + 0x10;
    }
    pfVar12 = (float *)((long)pvVar23 + lVar20 + lVar13);
    y_00 = (float *)((long)pvVar24 + lVar21 + lVar13);
    pfVar8 = (float *)((long)*pafVar25 + lVar22 + lVar13);
    for (; iVar11 < (int)uVar4; iVar11 = iVar11 + 1) {
      fVar14 = BinaryOp_x86_avx512_functor::binary_op_atan2::func
                         ((binary_op_atan2 *)&stack0xffffffffffffff03,pfVar8,y_00);
      *pfVar12 = fVar14;
      pfVar8 = pfVar8 + 1;
      y_00 = y_00 + 1;
      pfVar12 = pfVar12 + 1;
      uVar5 = extraout_RAX;
    }
  }
  return (int)uVar5;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}